

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.c
# Opt level: O2

int cmd_verb(char *arg)

{
  char *__s1;
  char cVar1;
  int iVar2;
  size_t sVar3;
  undefined8 uStack_30;
  
  sVar3 = strlen(arg);
  if (sVar3 < 5) {
    cmd_verb_help();
LAB_00109352:
    iVar2 = 1;
  }
  else {
    __s1 = arg + 5;
    iVar2 = strcmp(__s1,"error");
    if ((iVar2 == 0) || ((cVar1 = *__s1, cVar1 == '0' && (arg[6] == '\0')))) {
      ly_verb(0);
    }
    else {
      iVar2 = strcmp(__s1,"warning");
      if ((iVar2 == 0) || ((cVar1 == '1' && (arg[6] == '\0')))) {
        uStack_30 = 1;
      }
      else {
        iVar2 = strcmp(__s1,"verbose");
        if ((iVar2 != 0) && ((cVar1 != '2' || (arg[6] != '\0')))) {
          iVar2 = strcmp(__s1,"debug");
          if ((iVar2 == 0) || ((cVar1 == '3' && (arg[6] == '\0')))) {
            ly_verb(3);
            ly_verb_dbg(0x1f);
            return 0;
          }
          fprintf(_stderr,"Unknown verbosity \"%s\"\n",__s1);
          goto LAB_00109352;
        }
        uStack_30 = 2;
      }
      ly_verb(uStack_30);
    }
    iVar2 = 0;
    ly_verb_dbg(0);
  }
  return iVar2;
}

Assistant:

int
cmd_verb(const char *arg)
{
    const char *verb;
    if (strlen(arg) < 5) {
        cmd_verb_help();
        return 1;
    }

    verb = arg + 5;
    if (!strcmp(verb, "error") || !strcmp(verb, "0")) {
        ly_verb(LY_LLERR);
#ifndef NDEBUG
        ly_verb_dbg(0);
#endif
    } else if (!strcmp(verb, "warning") || !strcmp(verb, "1")) {
        ly_verb(LY_LLWRN);
#ifndef NDEBUG
        ly_verb_dbg(0);
#endif
    } else if (!strcmp(verb, "verbose")  || !strcmp(verb, "2")) {
        ly_verb(LY_LLVRB);
#ifndef NDEBUG
        ly_verb_dbg(0);
#endif
    } else if (!strcmp(verb, "debug")  || !strcmp(verb, "3")) {
        ly_verb(LY_LLDBG);
#ifndef NDEBUG
        ly_verb_dbg(LY_LDGDICT | LY_LDGYANG | LY_LDGYIN | LY_LDGXPATH | LY_LDGDIFF);
#endif
    } else {
        fprintf(stderr, "Unknown verbosity \"%s\"\n", verb);
        return 1;
    }

    return 0;
}